

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall ArgWrapper<char>::ArgWrapper<char_const*>(ArgWrapper<char> *this,char *in_args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_4a;
  allocator<char> local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,in_args,&local_49);
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,&local_4a);
  ArgWrapper(this,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ArgWrapper(Args... in_args)
		: ArgWrapper{ std::vector<std::basic_string<CharT>>{ in_args... } } {
		// Empty ctor body
	}